

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O0

reference __thiscall
jsoncons::jsonpath::detail::
recursive_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::evaluate(recursive_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *context,reference root,path_node_type *last,reference current,
          result_options options,error_code *param_7)

{
  bool bVar1;
  size_t sVar2;
  fd_set *in_RCX;
  fd_set *in_RDX;
  json_array_arg_t *in_RSI;
  recursive_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_RDI;
  fd_set *in_R8;
  undefined4 in_R9D;
  json_array_receiver<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  receiver;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *jptr;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  json_array_receiver<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffff40;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffff50;
  allocator<char> *in_stack_ffffffffffffff68;
  timeval *__timeout;
  json_array_arg_t *args;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *this_00;
  timeval local_68 [2];
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar3;
  reference local_8;
  
  uVar3 = 0;
  this_00 = (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
             *)&stack0xffffffffffffffbe;
  args = in_RSI;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::get_allocator((eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                   *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  local_8 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
            ::
            create_json<jsoncons::json_array_arg_t_const&,jsoncons::semantic_tag,std::allocator<char>>
                      (this_00,args,(semantic_tag *)in_RDI,in_stack_ffffffffffffff68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbe);
  __timeout = local_68;
  json_array_receiver<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::json_array_receiver
            (in_stack_ffffffffffffff40,
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  select(in_RDI,(int)in_RSI,in_RDX,in_RCX,in_R8,__timeout);
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::empty
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     CONCAT17(uVar3,in_stack_ffffffffffffffb8));
  if (bVar1) {
    local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              ::null_value(in_stack_ffffffffffffff50);
  }
  else {
    sVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                      (in_stack_ffffffffffffff48);
    if (sVar2 == 1) {
      local_8 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::operator[]
                          ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           in_stack_ffffffffffffff40,CONCAT44(in_stack_ffffffffffffff3c,in_R9D));
    }
  }
  json_array_receiver<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::~json_array_receiver
            ((json_array_receiver<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              *)0x5bc72a);
  return local_8;
}

Assistant:

reference evaluate(eval_context<Json,JsonReference>& context,
            reference root,
            const path_node_type& last, 
            reference current, 
            result_options options,
            std::error_code&) const override
        {
            auto jptr = context.create_json(json_array_arg, semantic_tag::none, context.get_allocator());
            json_array_receiver<Json,JsonReference> receiver(jptr);
            select(context, root, last, current, receiver, options);
            if (jptr->empty())
            {
                return context.null_value();
            }
            return jptr->size() == 1 ? (*jptr)[0] : *jptr;
        }